

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O1

int OBJ_obj2nid(ASN1_OBJECT *o)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  ushort *puVar4;
  
  iVar1 = 0;
  if ((o != (ASN1_OBJECT *)0x0) && (iVar1 = o->nid, iVar1 == 0)) {
    CRYPTO_MUTEX_lock_read(&global_added_lock);
    if (global_added_by_data != (lhash_st_ASN1_OBJECT *)0x0) {
      pvVar2 = OPENSSL_lh_retrieve((_LHASH *)global_added_by_data,o,lh_ASN1_OBJECT_call_hash_func,
                                   lh_ASN1_OBJECT_call_cmp_func);
      pvVar3 = pvVar2;
      if (pvVar2 != (void *)0x0) {
        CRYPTO_MUTEX_unlock_read(&global_added_lock);
        pvVar3 = (void *)(ulong)*(uint *)((long)pvVar2 + 0x10);
      }
      if (pvVar2 != (void *)0x0) {
        return (int)pvVar3;
      }
    }
    CRYPTO_MUTEX_unlock_read(&global_added_lock);
    puVar4 = (ushort *)bsearch(o,kNIDsInOIDOrder,0x371,2,obj_cmp);
    iVar1 = 0;
    if (puVar4 != (ushort *)0x0) {
      if (0x3c4 < *puVar4 - 1) {
        abort();
      }
      iVar1 = kObjects[*puVar4 - 1].nid;
    }
  }
  return iVar1;
}

Assistant:

int OBJ_obj2nid(const ASN1_OBJECT *obj) {
  if (obj == NULL) {
    return NID_undef;
  }

  if (obj->nid != 0) {
    return obj->nid;
  }

  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_data != NULL) {
    ASN1_OBJECT *match;

    match = lh_ASN1_OBJECT_retrieve(global_added_by_data, obj);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(obj, kNIDsInOIDOrder, OPENSSL_ARRAY_SIZE(kNIDsInOIDOrder),
              sizeof(kNIDsInOIDOrder[0]), obj_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}